

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

DnsNameEntry * __thiscall DnsNameEntry::CreateCopy(DnsNameEntry *this)

{
  uint8_t *puVar1;
  DnsNameEntry *local_18;
  DnsNameEntry *key;
  DnsNameEntry *this_local;
  
  local_18 = (DnsNameEntry *)operator_new(0x50);
  DnsNameEntry(local_18);
  if ((local_18 != (DnsNameEntry *)0x0) &&
     (local_18->name_len = this->name_len, this->name_len != 0)) {
    if ((local_18->name != (uint8_t *)0x0) && (local_18->name != (uint8_t *)0x0)) {
      operator_delete__(local_18->name);
    }
    puVar1 = (uint8_t *)operator_new__(this->name_len + 1);
    local_18->name = puVar1;
    if (local_18->name == (uint8_t *)0x0) {
      if (local_18 != (DnsNameEntry *)0x0) {
        ~DnsNameEntry(local_18);
        operator_delete(local_18);
      }
      local_18 = (DnsNameEntry *)0x0;
    }
    else {
      memcpy(local_18->name,this->name,this->name_len);
      local_18->name[this->name_len] = '\0';
      local_18->count = this->count;
      local_18->is_nx = this->is_nx;
      local_18->leakType = this->leakType;
      memcpy(local_18->addr,this->addr,this->addr_len);
      local_18->addr_len = this->addr_len;
      local_18->rr_type = this->rr_type;
      local_18->flags = this->flags;
    }
  }
  return local_18;
}

Assistant:

DnsNameEntry* DnsNameEntry::CreateCopy()
{
    DnsNameEntry* key = new DnsNameEntry();

    if (key != NULL)
    {
        key->name_len = name_len;
        if (name_len > 0) {
            if (key->name != NULL) {
                delete[] key->name;
            }

            key->name = new uint8_t[(size_t)name_len + 1];

            if (key->name == NULL) {
                delete key;
                key = NULL;
            }
            else {
                memcpy(key->name, name, name_len);
                key->name[name_len] = 0;
                key->count = count;
                key->is_nx = is_nx;
                key->leakType = leakType;
                memcpy(key->addr, addr, addr_len);
                key->addr_len = addr_len;
                key->rr_type = rr_type;
                key->flags = flags;
            }
        }
    }

    return key;
}